

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesRasClearStateExp(zes_ras_handle_t hRas,zes_ras_error_category_exp_t category)

{
  zes_pfnRasClearStateExp_t pfnClearStateExp;
  dditable_t *dditable;
  ze_result_t result;
  zes_ras_error_category_exp_t category_local;
  zes_ras_handle_t hRas_local;
  
  if (*(code **)(*(long *)(hRas + 8) + 0xcc0) == (code *)0x0) {
    hRas_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hRas_local._4_4_ = (**(code **)(*(long *)(hRas + 8) + 0xcc0))(*(undefined8 *)hRas,category);
  }
  return hRas_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasClearStateExp(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_error_category_exp_t category           ///< [in] category for which error counter is to be cleared.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_ras_object_t*>( hRas )->dditable;
        auto pfnClearStateExp = dditable->zes.RasExp.pfnClearStateExp;
        if( nullptr == pfnClearStateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hRas = reinterpret_cast<zes_ras_object_t*>( hRas )->handle;

        // forward to device-driver
        result = pfnClearStateExp( hRas, category );

        return result;
    }